

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct32_stage7_sse4_1
               (__m128i *bf1,__m128i *cospim32,__m128i *cospi32,__m128i *clamp_lo,__m128i *clamp_hi,
               __m128i *rounding,int bit)

{
  __m128i alVar1;
  __m128i alVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar17;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar18 [16];
  int iVar22;
  uint uVar23;
  int iVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  undefined1 auVar24 [16];
  int iVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  __m128i y;
  int iVar37;
  uint uVar38;
  
  iVar8 = (int)bf1[7][0];
  iVar12 = *(int *)((long)bf1[7] + 4);
  iVar14 = (int)bf1[7][1];
  iVar16 = *(int *)((long)bf1[7] + 0xc);
  iVar22 = (int)(*bf1)[0];
  iVar25 = *(int *)((long)*bf1 + 4);
  iVar27 = (int)(*bf1)[1];
  iVar29 = *(int *)((long)*bf1 + 0xc);
  iVar17 = (int)bf1[1][0];
  iVar19 = *(int *)((long)bf1[1] + 4);
  iVar20 = (int)bf1[1][1];
  iVar21 = *(int *)((long)bf1[1] + 0xc);
  iVar7 = (int)bf1[2][0];
  iVar11 = *(int *)((long)bf1[2] + 4);
  iVar13 = (int)bf1[2][1];
  iVar15 = *(int *)((long)bf1[2] + 0xc);
  iVar3 = (int)bf1[5][0];
  iVar4 = *(int *)((long)bf1[5] + 4);
  iVar5 = (int)bf1[5][1];
  iVar6 = *(int *)((long)bf1[5] + 0xc);
  iVar31 = iVar8 + iVar22;
  iVar33 = iVar12 + iVar25;
  iVar35 = iVar14 + iVar27;
  iVar37 = iVar16 + iVar29;
  iVar22 = iVar22 - iVar8;
  iVar25 = iVar25 - iVar12;
  iVar27 = iVar27 - iVar14;
  iVar29 = iVar29 - iVar16;
  iVar8 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar14 = (int)(*clamp_lo)[1];
  iVar16 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar31 < iVar8) * iVar8 | (uint)(iVar31 >= iVar8) * iVar31;
  uVar34 = (uint)(iVar33 < iVar12) * iVar12 | (uint)(iVar33 >= iVar12) * iVar33;
  uVar36 = (uint)(iVar35 < iVar14) * iVar14 | (uint)(iVar35 >= iVar14) * iVar35;
  uVar38 = (uint)(iVar37 < iVar16) * iVar16 | (uint)(iVar37 >= iVar16) * iVar37;
  iVar31 = (int)(*clamp_hi)[0];
  iVar33 = *(int *)((long)*clamp_hi + 4);
  iVar35 = (int)(*clamp_hi)[1];
  iVar37 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar26 = (uint)(iVar25 < iVar12) * iVar12 | (uint)(iVar25 >= iVar12) * iVar25;
  uVar28 = (uint)(iVar27 < iVar14) * iVar14 | (uint)(iVar27 >= iVar14) * iVar27;
  uVar30 = (uint)(iVar29 < iVar16) * iVar16 | (uint)(iVar29 >= iVar16) * iVar29;
  *(uint *)*bf1 = (uint)(iVar31 < (int)uVar32) * iVar31 | (iVar31 >= (int)uVar32) * uVar32;
  *(uint *)((long)*bf1 + 4) =
       (uint)(iVar33 < (int)uVar34) * iVar33 | (iVar33 >= (int)uVar34) * uVar34;
  *(uint *)(*bf1 + 1) = (uint)(iVar35 < (int)uVar36) * iVar35 | (iVar35 >= (int)uVar36) * uVar36;
  *(uint *)((long)*bf1 + 0xc) =
       (uint)(iVar37 < (int)uVar38) * iVar37 | (iVar37 >= (int)uVar38) * uVar38;
  *(uint *)bf1[7] = (uint)(iVar31 < (int)uVar23) * iVar31 | (iVar31 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[7] + 4) =
       (uint)(iVar33 < (int)uVar26) * iVar33 | (iVar33 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[7] + 1) = (uint)(iVar35 < (int)uVar28) * iVar35 | (iVar35 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[7] + 0xc) =
       (uint)(iVar37 < (int)uVar30) * iVar37 | (iVar37 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[6][0];
  iVar12 = *(int *)((long)bf1[6] + 4);
  iVar14 = (int)bf1[6][1];
  iVar16 = *(int *)((long)bf1[6] + 0xc);
  iVar22 = iVar8 + iVar17;
  iVar25 = iVar12 + iVar19;
  iVar27 = iVar14 + iVar20;
  iVar29 = iVar16 + iVar21;
  iVar17 = iVar17 - iVar8;
  iVar19 = iVar19 - iVar12;
  iVar20 = iVar20 - iVar14;
  iVar21 = iVar21 - iVar16;
  iVar8 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar14 = (int)(*clamp_lo)[1];
  iVar16 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar34 = (uint)(iVar25 < iVar12) * iVar12 | (uint)(iVar25 >= iVar12) * iVar25;
  uVar36 = (uint)(iVar27 < iVar14) * iVar14 | (uint)(iVar27 >= iVar14) * iVar27;
  uVar38 = (uint)(iVar29 < iVar16) * iVar16 | (uint)(iVar29 >= iVar16) * iVar29;
  iVar22 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar17 < iVar8) * iVar8 | (uint)(iVar17 >= iVar8) * iVar17;
  uVar26 = (uint)(iVar19 < iVar12) * iVar12 | (uint)(iVar19 >= iVar12) * iVar19;
  uVar28 = (uint)(iVar20 < iVar14) * iVar14 | (uint)(iVar20 >= iVar14) * iVar20;
  uVar30 = (uint)(iVar21 < iVar16) * iVar16 | (uint)(iVar21 >= iVar16) * iVar21;
  *(uint *)bf1[1] = (uint)(iVar22 < (int)uVar32) * iVar22 | (iVar22 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[1] + 4) =
       (uint)(iVar25 < (int)uVar34) * iVar25 | (iVar25 >= (int)uVar34) * uVar34;
  *(uint *)(bf1[1] + 1) = (uint)(iVar27 < (int)uVar36) * iVar27 | (iVar27 >= (int)uVar36) * uVar36;
  *(uint *)((long)bf1[1] + 0xc) =
       (uint)(iVar29 < (int)uVar38) * iVar29 | (iVar29 >= (int)uVar38) * uVar38;
  *(uint *)bf1[6] = (uint)(iVar22 < (int)uVar23) * iVar22 | (iVar22 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[6] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[6] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[6] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  iVar22 = iVar3 + iVar7;
  iVar25 = iVar4 + iVar11;
  iVar27 = iVar5 + iVar13;
  iVar29 = iVar6 + iVar15;
  iVar7 = iVar7 - iVar3;
  iVar11 = iVar11 - iVar4;
  iVar13 = iVar13 - iVar5;
  iVar15 = iVar15 - iVar6;
  iVar8 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar14 = (int)(*clamp_lo)[1];
  iVar16 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar34 = (uint)(iVar25 < iVar12) * iVar12 | (uint)(iVar25 >= iVar12) * iVar25;
  uVar36 = (uint)(iVar27 < iVar14) * iVar14 | (uint)(iVar27 >= iVar14) * iVar27;
  uVar38 = (uint)(iVar29 < iVar16) * iVar16 | (uint)(iVar29 >= iVar16) * iVar29;
  iVar22 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar7 < iVar8) * iVar8 | (uint)(iVar7 >= iVar8) * iVar7;
  uVar26 = (uint)(iVar11 < iVar12) * iVar12 | (uint)(iVar11 >= iVar12) * iVar11;
  uVar28 = (uint)(iVar13 < iVar14) * iVar14 | (uint)(iVar13 >= iVar14) * iVar13;
  uVar30 = (uint)(iVar15 < iVar16) * iVar16 | (uint)(iVar15 >= iVar16) * iVar15;
  *(uint *)bf1[2] = (uint)(iVar22 < (int)uVar32) * iVar22 | (iVar22 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[2] + 4) =
       (uint)(iVar25 < (int)uVar34) * iVar25 | (iVar25 >= (int)uVar34) * uVar34;
  *(uint *)(bf1[2] + 1) = (uint)(iVar27 < (int)uVar36) * iVar27 | (iVar27 >= (int)uVar36) * uVar36;
  *(uint *)((long)bf1[2] + 0xc) =
       (uint)(iVar29 < (int)uVar38) * iVar29 | (iVar29 >= (int)uVar38) * uVar38;
  *(uint *)bf1[5] = (uint)(iVar22 < (int)uVar23) * iVar22 | (iVar22 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[5] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[5] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[5] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[3][0];
  iVar12 = *(int *)((long)bf1[3] + 4);
  iVar14 = (int)bf1[3][1];
  iVar16 = *(int *)((long)bf1[3] + 0xc);
  iVar22 = (int)bf1[4][0];
  iVar25 = *(int *)((long)bf1[4] + 4);
  iVar27 = (int)bf1[4][1];
  iVar29 = *(int *)((long)bf1[4] + 0xc);
  iVar17 = iVar22 + iVar8;
  iVar19 = iVar25 + iVar12;
  iVar20 = iVar27 + iVar14;
  iVar21 = iVar29 + iVar16;
  iVar8 = iVar8 - iVar22;
  iVar12 = iVar12 - iVar25;
  iVar14 = iVar14 - iVar27;
  iVar16 = iVar16 - iVar29;
  iVar22 = (int)(*clamp_lo)[0];
  iVar25 = *(int *)((long)*clamp_lo + 4);
  iVar27 = (int)(*clamp_lo)[1];
  iVar29 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar22) * iVar22 | (uint)(iVar17 >= iVar22) * iVar17;
  uVar34 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar36 = (uint)(iVar20 < iVar27) * iVar27 | (uint)(iVar20 >= iVar27) * iVar20;
  uVar38 = (uint)(iVar21 < iVar29) * iVar29 | (uint)(iVar21 >= iVar29) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar8 < iVar22) * iVar22 | (uint)(iVar8 >= iVar22) * iVar8;
  uVar26 = (uint)(iVar12 < iVar25) * iVar25 | (uint)(iVar12 >= iVar25) * iVar12;
  uVar28 = (uint)(iVar14 < iVar27) * iVar27 | (uint)(iVar14 >= iVar27) * iVar14;
  uVar30 = (uint)(iVar16 < iVar29) * iVar29 | (uint)(iVar16 >= iVar29) * iVar16;
  *(uint *)bf1[3] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[3] + 4) =
       (uint)(iVar19 < (int)uVar34) * iVar19 | (iVar19 >= (int)uVar34) * uVar34;
  *(uint *)(bf1[3] + 1) = (uint)(iVar20 < (int)uVar36) * iVar20 | (iVar20 >= (int)uVar36) * uVar36;
  *(uint *)((long)bf1[3] + 0xc) =
       (uint)(iVar21 < (int)uVar38) * iVar21 | (iVar21 >= (int)uVar38) * uVar38;
  *(uint *)bf1[4] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[4] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[4] + 1) = (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[4] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  alVar1 = bf1[10];
  alVar2 = bf1[0xd];
  auVar9 = pmulld((undefined1  [16])*cospim32,(undefined1  [16])alVar1);
  auVar24 = pmulld((undefined1  [16])alVar2,(undefined1  [16])*cospi32);
  iVar8 = (int)(*rounding)[0];
  iVar12 = *(int *)((long)*rounding + 4);
  iVar14 = (int)(*rounding)[1];
  iVar16 = *(int *)((long)*rounding + 0xc);
  auVar10 = ZEXT416((uint)bit);
  auVar18._0_4_ = (int)alVar2[0] + (int)alVar1[0];
  auVar18._4_4_ = alVar2[0]._4_4_ + alVar1[0]._4_4_;
  auVar18._8_4_ = (int)alVar2[1] + (int)alVar1[1];
  auVar18._12_4_ = alVar2[1]._4_4_ + alVar1[1]._4_4_;
  auVar18 = pmulld(auVar18,(undefined1  [16])*cospi32);
  *(int *)bf1[0xd] = auVar18._0_4_ + iVar8 >> auVar10;
  *(int *)((long)bf1[0xd] + 4) = auVar18._4_4_ + iVar12 >> auVar10;
  *(int *)(bf1[0xd] + 1) = auVar18._8_4_ + iVar14 >> auVar10;
  *(int *)((long)bf1[0xd] + 0xc) = auVar18._12_4_ + iVar16 >> auVar10;
  *(int *)bf1[10] = auVar24._0_4_ + auVar9._0_4_ + iVar8 >> auVar10;
  *(int *)((long)bf1[10] + 4) = auVar24._4_4_ + auVar9._4_4_ + iVar12 >> auVar10;
  *(int *)(bf1[10] + 1) = auVar24._8_4_ + auVar9._8_4_ + iVar14 >> auVar10;
  *(int *)((long)bf1[10] + 0xc) = auVar24._12_4_ + auVar9._12_4_ + iVar16 >> auVar10;
  alVar1 = bf1[0xb];
  alVar2 = bf1[0xc];
  auVar18 = pmulld((undefined1  [16])*cospim32,(undefined1  [16])alVar1);
  auVar24 = pmulld((undefined1  [16])alVar2,(undefined1  [16])*cospi32);
  iVar8 = (int)(*rounding)[0];
  iVar12 = *(int *)((long)*rounding + 4);
  iVar14 = (int)(*rounding)[1];
  iVar16 = *(int *)((long)*rounding + 0xc);
  auVar9._0_4_ = (int)alVar2[0] + (int)alVar1[0];
  auVar9._4_4_ = alVar2[0]._4_4_ + alVar1[0]._4_4_;
  auVar9._8_4_ = (int)alVar2[1] + (int)alVar1[1];
  auVar9._12_4_ = alVar2[1]._4_4_ + alVar1[1]._4_4_;
  auVar9 = pmulld(auVar9,(undefined1  [16])*cospi32);
  *(int *)bf1[0xc] = auVar9._0_4_ + iVar8 >> auVar10;
  *(int *)((long)bf1[0xc] + 4) = auVar9._4_4_ + iVar12 >> auVar10;
  *(int *)(bf1[0xc] + 1) = auVar9._8_4_ + iVar14 >> auVar10;
  *(int *)((long)bf1[0xc] + 0xc) = auVar9._12_4_ + iVar16 >> auVar10;
  *(int *)bf1[0xb] = auVar24._0_4_ + auVar18._0_4_ + iVar8 >> auVar10;
  *(int *)((long)bf1[0xb] + 4) = auVar24._4_4_ + auVar18._4_4_ + iVar12 >> auVar10;
  *(int *)(bf1[0xb] + 1) = auVar24._8_4_ + auVar18._8_4_ + iVar14 >> auVar10;
  *(int *)((long)bf1[0xb] + 0xc) = auVar24._12_4_ + auVar18._12_4_ + iVar16 >> auVar10;
  iVar8 = (int)bf1[0x10][0];
  iVar12 = *(int *)((long)bf1[0x10] + 4);
  iVar14 = (int)bf1[0x10][1];
  iVar16 = *(int *)((long)bf1[0x10] + 0xc);
  iVar22 = (int)bf1[0x17][0];
  iVar25 = *(int *)((long)bf1[0x17] + 4);
  iVar27 = (int)bf1[0x17][1];
  iVar29 = *(int *)((long)bf1[0x17] + 0xc);
  iVar17 = iVar22 + iVar8;
  iVar19 = iVar25 + iVar12;
  iVar20 = iVar27 + iVar14;
  iVar21 = iVar29 + iVar16;
  iVar8 = iVar8 - iVar22;
  iVar12 = iVar12 - iVar25;
  iVar14 = iVar14 - iVar27;
  iVar16 = iVar16 - iVar29;
  iVar22 = (int)(*clamp_lo)[0];
  iVar25 = *(int *)((long)*clamp_lo + 4);
  iVar27 = (int)(*clamp_lo)[1];
  iVar29 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar22) * iVar22 | (uint)(iVar17 >= iVar22) * iVar17;
  uVar34 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar36 = (uint)(iVar20 < iVar27) * iVar27 | (uint)(iVar20 >= iVar27) * iVar20;
  uVar38 = (uint)(iVar21 < iVar29) * iVar29 | (uint)(iVar21 >= iVar29) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar8 < iVar22) * iVar22 | (uint)(iVar8 >= iVar22) * iVar8;
  uVar26 = (uint)(iVar12 < iVar25) * iVar25 | (uint)(iVar12 >= iVar25) * iVar12;
  uVar28 = (uint)(iVar14 < iVar27) * iVar27 | (uint)(iVar14 >= iVar27) * iVar14;
  uVar30 = (uint)(iVar16 < iVar29) * iVar29 | (uint)(iVar16 >= iVar29) * iVar16;
  *(uint *)bf1[0x10] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[0x10] + 4) =
       (uint)(iVar19 < (int)uVar34) * iVar19 | (iVar19 >= (int)uVar34) * uVar34;
  *(uint *)(bf1[0x10] + 1) =
       (uint)(iVar20 < (int)uVar36) * iVar20 | (iVar20 >= (int)uVar36) * uVar36;
  *(uint *)((long)bf1[0x10] + 0xc) =
       (uint)(iVar21 < (int)uVar38) * iVar21 | (iVar21 >= (int)uVar38) * uVar38;
  *(uint *)bf1[0x17] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0x17] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0x17] + 1) =
       (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[0x17] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[0x11][0];
  iVar12 = *(int *)((long)bf1[0x11] + 4);
  iVar14 = (int)bf1[0x11][1];
  iVar16 = *(int *)((long)bf1[0x11] + 0xc);
  iVar22 = (int)bf1[0x16][0];
  iVar25 = *(int *)((long)bf1[0x16] + 4);
  iVar27 = (int)bf1[0x16][1];
  iVar29 = *(int *)((long)bf1[0x16] + 0xc);
  iVar17 = iVar22 + iVar8;
  iVar19 = iVar25 + iVar12;
  iVar20 = iVar27 + iVar14;
  iVar21 = iVar29 + iVar16;
  iVar8 = iVar8 - iVar22;
  iVar12 = iVar12 - iVar25;
  iVar14 = iVar14 - iVar27;
  iVar16 = iVar16 - iVar29;
  iVar22 = (int)(*clamp_lo)[0];
  iVar25 = *(int *)((long)*clamp_lo + 4);
  iVar27 = (int)(*clamp_lo)[1];
  iVar29 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar22) * iVar22 | (uint)(iVar17 >= iVar22) * iVar17;
  uVar34 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar36 = (uint)(iVar20 < iVar27) * iVar27 | (uint)(iVar20 >= iVar27) * iVar20;
  uVar38 = (uint)(iVar21 < iVar29) * iVar29 | (uint)(iVar21 >= iVar29) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar8 < iVar22) * iVar22 | (uint)(iVar8 >= iVar22) * iVar8;
  uVar26 = (uint)(iVar12 < iVar25) * iVar25 | (uint)(iVar12 >= iVar25) * iVar12;
  uVar28 = (uint)(iVar14 < iVar27) * iVar27 | (uint)(iVar14 >= iVar27) * iVar14;
  uVar30 = (uint)(iVar16 < iVar29) * iVar29 | (uint)(iVar16 >= iVar29) * iVar16;
  *(uint *)bf1[0x11] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[0x11] + 4) =
       (uint)(iVar19 < (int)uVar34) * iVar19 | (iVar19 >= (int)uVar34) * uVar34;
  *(uint *)(bf1[0x11] + 1) =
       (uint)(iVar20 < (int)uVar36) * iVar20 | (iVar20 >= (int)uVar36) * uVar36;
  *(uint *)((long)bf1[0x11] + 0xc) =
       (uint)(iVar21 < (int)uVar38) * iVar21 | (iVar21 >= (int)uVar38) * uVar38;
  *(uint *)bf1[0x16] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0x16] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0x16] + 1) =
       (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[0x16] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[0x12][0];
  iVar12 = *(int *)((long)bf1[0x12] + 4);
  iVar14 = (int)bf1[0x12][1];
  iVar16 = *(int *)((long)bf1[0x12] + 0xc);
  iVar22 = (int)bf1[0x15][0];
  iVar25 = *(int *)((long)bf1[0x15] + 4);
  iVar27 = (int)bf1[0x15][1];
  iVar29 = *(int *)((long)bf1[0x15] + 0xc);
  iVar17 = iVar22 + iVar8;
  iVar19 = iVar25 + iVar12;
  iVar20 = iVar27 + iVar14;
  iVar21 = iVar29 + iVar16;
  iVar8 = iVar8 - iVar22;
  iVar12 = iVar12 - iVar25;
  iVar14 = iVar14 - iVar27;
  iVar16 = iVar16 - iVar29;
  iVar22 = (int)(*clamp_lo)[0];
  iVar25 = *(int *)((long)*clamp_lo + 4);
  iVar27 = (int)(*clamp_lo)[1];
  iVar29 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar22) * iVar22 | (uint)(iVar17 >= iVar22) * iVar17;
  uVar34 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar36 = (uint)(iVar20 < iVar27) * iVar27 | (uint)(iVar20 >= iVar27) * iVar20;
  uVar38 = (uint)(iVar21 < iVar29) * iVar29 | (uint)(iVar21 >= iVar29) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar8 < iVar22) * iVar22 | (uint)(iVar8 >= iVar22) * iVar8;
  uVar26 = (uint)(iVar12 < iVar25) * iVar25 | (uint)(iVar12 >= iVar25) * iVar12;
  uVar28 = (uint)(iVar14 < iVar27) * iVar27 | (uint)(iVar14 >= iVar27) * iVar14;
  uVar30 = (uint)(iVar16 < iVar29) * iVar29 | (uint)(iVar16 >= iVar29) * iVar16;
  *(uint *)bf1[0x12] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[0x12] + 4) =
       (uint)(iVar19 < (int)uVar34) * iVar19 | (iVar19 >= (int)uVar34) * uVar34;
  *(uint *)(bf1[0x12] + 1) =
       (uint)(iVar20 < (int)uVar36) * iVar20 | (iVar20 >= (int)uVar36) * uVar36;
  *(uint *)((long)bf1[0x12] + 0xc) =
       (uint)(iVar21 < (int)uVar38) * iVar21 | (iVar21 >= (int)uVar38) * uVar38;
  *(uint *)bf1[0x15] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0x15] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0x15] + 1) =
       (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[0x15] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[0x13][0];
  iVar12 = *(int *)((long)bf1[0x13] + 4);
  iVar14 = (int)bf1[0x13][1];
  iVar16 = *(int *)((long)bf1[0x13] + 0xc);
  iVar22 = (int)bf1[0x14][0];
  iVar25 = *(int *)((long)bf1[0x14] + 4);
  iVar27 = (int)bf1[0x14][1];
  iVar29 = *(int *)((long)bf1[0x14] + 0xc);
  iVar17 = iVar22 + iVar8;
  iVar19 = iVar25 + iVar12;
  iVar20 = iVar27 + iVar14;
  iVar21 = iVar29 + iVar16;
  iVar8 = iVar8 - iVar22;
  iVar12 = iVar12 - iVar25;
  iVar14 = iVar14 - iVar27;
  iVar16 = iVar16 - iVar29;
  iVar22 = (int)(*clamp_lo)[0];
  iVar25 = *(int *)((long)*clamp_lo + 4);
  iVar27 = (int)(*clamp_lo)[1];
  iVar29 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar22) * iVar22 | (uint)(iVar17 >= iVar22) * iVar17;
  uVar34 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar36 = (uint)(iVar20 < iVar27) * iVar27 | (uint)(iVar20 >= iVar27) * iVar20;
  uVar38 = (uint)(iVar21 < iVar29) * iVar29 | (uint)(iVar21 >= iVar29) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar8 < iVar22) * iVar22 | (uint)(iVar8 >= iVar22) * iVar8;
  uVar26 = (uint)(iVar12 < iVar25) * iVar25 | (uint)(iVar12 >= iVar25) * iVar12;
  uVar28 = (uint)(iVar14 < iVar27) * iVar27 | (uint)(iVar14 >= iVar27) * iVar14;
  uVar30 = (uint)(iVar16 < iVar29) * iVar29 | (uint)(iVar16 >= iVar29) * iVar16;
  *(uint *)bf1[0x13] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[0x13] + 4) =
       (uint)(iVar19 < (int)uVar34) * iVar19 | (iVar19 >= (int)uVar34) * uVar34;
  *(uint *)(bf1[0x13] + 1) =
       (uint)(iVar20 < (int)uVar36) * iVar20 | (iVar20 >= (int)uVar36) * uVar36;
  *(uint *)((long)bf1[0x13] + 0xc) =
       (uint)(iVar21 < (int)uVar38) * iVar21 | (iVar21 >= (int)uVar38) * uVar38;
  *(uint *)bf1[0x14] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0x14] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0x14] + 1) =
       (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[0x14] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[0x18][0];
  iVar12 = *(int *)((long)bf1[0x18] + 4);
  iVar14 = (int)bf1[0x18][1];
  iVar16 = *(int *)((long)bf1[0x18] + 0xc);
  iVar22 = (int)bf1[0x1f][0];
  iVar25 = *(int *)((long)bf1[0x1f] + 4);
  iVar27 = (int)bf1[0x1f][1];
  iVar29 = *(int *)((long)bf1[0x1f] + 0xc);
  iVar17 = iVar8 + iVar22;
  iVar19 = iVar12 + iVar25;
  iVar20 = iVar14 + iVar27;
  iVar21 = iVar16 + iVar29;
  iVar22 = iVar22 - iVar8;
  iVar25 = iVar25 - iVar12;
  iVar27 = iVar27 - iVar14;
  iVar29 = iVar29 - iVar16;
  iVar8 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar14 = (int)(*clamp_lo)[1];
  iVar16 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar8) * iVar8 | (uint)(iVar17 >= iVar8) * iVar17;
  uVar34 = (uint)(iVar19 < iVar12) * iVar12 | (uint)(iVar19 >= iVar12) * iVar19;
  uVar36 = (uint)(iVar20 < iVar14) * iVar14 | (uint)(iVar20 >= iVar14) * iVar20;
  uVar38 = (uint)(iVar21 < iVar16) * iVar16 | (uint)(iVar21 >= iVar16) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar26 = (uint)(iVar25 < iVar12) * iVar12 | (uint)(iVar25 >= iVar12) * iVar25;
  uVar28 = (uint)(iVar27 < iVar14) * iVar14 | (uint)(iVar27 >= iVar14) * iVar27;
  uVar30 = (uint)(iVar29 < iVar16) * iVar16 | (uint)(iVar29 >= iVar16) * iVar29;
  *(uint *)bf1[0x1f] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[0x1f] + 4) =
       (uint)(iVar19 < (int)uVar34) * iVar19 | (iVar19 >= (int)uVar34) * uVar34;
  *(uint *)(bf1[0x1f] + 1) =
       (uint)(iVar20 < (int)uVar36) * iVar20 | (iVar20 >= (int)uVar36) * uVar36;
  *(uint *)((long)bf1[0x1f] + 0xc) =
       (uint)(iVar21 < (int)uVar38) * iVar21 | (iVar21 >= (int)uVar38) * uVar38;
  *(uint *)bf1[0x18] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0x18] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0x18] + 1) =
       (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[0x18] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[0x19][0];
  iVar12 = *(int *)((long)bf1[0x19] + 4);
  iVar14 = (int)bf1[0x19][1];
  iVar16 = *(int *)((long)bf1[0x19] + 0xc);
  iVar22 = (int)bf1[0x1e][0];
  iVar25 = *(int *)((long)bf1[0x1e] + 4);
  iVar27 = (int)bf1[0x1e][1];
  iVar29 = *(int *)((long)bf1[0x1e] + 0xc);
  iVar17 = iVar8 + iVar22;
  iVar19 = iVar12 + iVar25;
  iVar20 = iVar14 + iVar27;
  iVar21 = iVar16 + iVar29;
  iVar22 = iVar22 - iVar8;
  iVar25 = iVar25 - iVar12;
  iVar27 = iVar27 - iVar14;
  iVar29 = iVar29 - iVar16;
  iVar8 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar14 = (int)(*clamp_lo)[1];
  iVar16 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar8) * iVar8 | (uint)(iVar17 >= iVar8) * iVar17;
  uVar34 = (uint)(iVar19 < iVar12) * iVar12 | (uint)(iVar19 >= iVar12) * iVar19;
  uVar36 = (uint)(iVar20 < iVar14) * iVar14 | (uint)(iVar20 >= iVar14) * iVar20;
  uVar38 = (uint)(iVar21 < iVar16) * iVar16 | (uint)(iVar21 >= iVar16) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar26 = (uint)(iVar25 < iVar12) * iVar12 | (uint)(iVar25 >= iVar12) * iVar25;
  uVar28 = (uint)(iVar27 < iVar14) * iVar14 | (uint)(iVar27 >= iVar14) * iVar27;
  uVar30 = (uint)(iVar29 < iVar16) * iVar16 | (uint)(iVar29 >= iVar16) * iVar29;
  *(uint *)bf1[0x1e] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[0x1e] + 4) =
       (uint)(iVar19 < (int)uVar34) * iVar19 | (iVar19 >= (int)uVar34) * uVar34;
  *(uint *)(bf1[0x1e] + 1) =
       (uint)(iVar20 < (int)uVar36) * iVar20 | (iVar20 >= (int)uVar36) * uVar36;
  *(uint *)((long)bf1[0x1e] + 0xc) =
       (uint)(iVar21 < (int)uVar38) * iVar21 | (iVar21 >= (int)uVar38) * uVar38;
  *(uint *)bf1[0x19] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0x19] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0x19] + 1) =
       (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[0x19] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[0x1a][0];
  iVar12 = *(int *)((long)bf1[0x1a] + 4);
  iVar14 = (int)bf1[0x1a][1];
  iVar16 = *(int *)((long)bf1[0x1a] + 0xc);
  iVar22 = (int)bf1[0x1d][0];
  iVar25 = *(int *)((long)bf1[0x1d] + 4);
  iVar27 = (int)bf1[0x1d][1];
  iVar29 = *(int *)((long)bf1[0x1d] + 0xc);
  iVar17 = iVar8 + iVar22;
  iVar19 = iVar12 + iVar25;
  iVar20 = iVar14 + iVar27;
  iVar21 = iVar16 + iVar29;
  iVar22 = iVar22 - iVar8;
  iVar25 = iVar25 - iVar12;
  iVar27 = iVar27 - iVar14;
  iVar29 = iVar29 - iVar16;
  iVar8 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar14 = (int)(*clamp_lo)[1];
  iVar16 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar8) * iVar8 | (uint)(iVar17 >= iVar8) * iVar17;
  uVar34 = (uint)(iVar19 < iVar12) * iVar12 | (uint)(iVar19 >= iVar12) * iVar19;
  uVar36 = (uint)(iVar20 < iVar14) * iVar14 | (uint)(iVar20 >= iVar14) * iVar20;
  uVar38 = (uint)(iVar21 < iVar16) * iVar16 | (uint)(iVar21 >= iVar16) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar26 = (uint)(iVar25 < iVar12) * iVar12 | (uint)(iVar25 >= iVar12) * iVar25;
  uVar28 = (uint)(iVar27 < iVar14) * iVar14 | (uint)(iVar27 >= iVar14) * iVar27;
  uVar30 = (uint)(iVar29 < iVar16) * iVar16 | (uint)(iVar29 >= iVar16) * iVar29;
  *(uint *)bf1[0x1d] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[0x1d] + 4) =
       (uint)(iVar19 < (int)uVar34) * iVar19 | (iVar19 >= (int)uVar34) * uVar34;
  *(uint *)(bf1[0x1d] + 1) =
       (uint)(iVar20 < (int)uVar36) * iVar20 | (iVar20 >= (int)uVar36) * uVar36;
  *(uint *)((long)bf1[0x1d] + 0xc) =
       (uint)(iVar21 < (int)uVar38) * iVar21 | (iVar21 >= (int)uVar38) * uVar38;
  *(uint *)bf1[0x1a] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0x1a] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0x1a] + 1) =
       (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[0x1a] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[0x1b][0];
  iVar12 = *(int *)((long)bf1[0x1b] + 4);
  iVar14 = (int)bf1[0x1b][1];
  iVar16 = *(int *)((long)bf1[0x1b] + 0xc);
  iVar22 = (int)bf1[0x1c][0];
  iVar25 = *(int *)((long)bf1[0x1c] + 4);
  iVar27 = (int)bf1[0x1c][1];
  iVar29 = *(int *)((long)bf1[0x1c] + 0xc);
  iVar17 = iVar8 + iVar22;
  iVar19 = iVar12 + iVar25;
  iVar20 = iVar14 + iVar27;
  iVar21 = iVar16 + iVar29;
  iVar22 = iVar22 - iVar8;
  iVar25 = iVar25 - iVar12;
  iVar27 = iVar27 - iVar14;
  iVar29 = iVar29 - iVar16;
  iVar8 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar14 = (int)(*clamp_lo)[1];
  iVar16 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar8) * iVar8 | (uint)(iVar17 >= iVar8) * iVar17;
  uVar34 = (uint)(iVar19 < iVar12) * iVar12 | (uint)(iVar19 >= iVar12) * iVar19;
  uVar36 = (uint)(iVar20 < iVar14) * iVar14 | (uint)(iVar20 >= iVar14) * iVar20;
  uVar38 = (uint)(iVar21 < iVar16) * iVar16 | (uint)(iVar21 >= iVar16) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar26 = (uint)(iVar25 < iVar12) * iVar12 | (uint)(iVar25 >= iVar12) * iVar25;
  uVar28 = (uint)(iVar27 < iVar14) * iVar14 | (uint)(iVar27 >= iVar14) * iVar27;
  uVar30 = (uint)(iVar29 < iVar16) * iVar16 | (uint)(iVar29 >= iVar16) * iVar29;
  *(uint *)bf1[0x1c] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[0x1c] + 4) =
       (uint)(iVar19 < (int)uVar34) * iVar19 | (iVar19 >= (int)uVar34) * uVar34;
  *(uint *)(bf1[0x1c] + 1) =
       (uint)(iVar20 < (int)uVar36) * iVar20 | (iVar20 >= (int)uVar36) * uVar36;
  *(uint *)((long)bf1[0x1c] + 0xc) =
       (uint)(iVar21 < (int)uVar38) * iVar21 | (iVar21 >= (int)uVar38) * uVar38;
  *(uint *)bf1[0x1b] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0x1b] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0x1b] + 1) =
       (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[0x1b] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  return;
}

Assistant:

static inline void idct32_stage7_sse4_1(__m128i *bf1, const __m128i *cospim32,
                                        const __m128i *cospi32,
                                        const __m128i *clamp_lo,
                                        const __m128i *clamp_hi,
                                        const __m128i *rounding, int bit) {
  __m128i temp1, temp2;
  addsub_sse4_1(bf1[0], bf1[7], bf1 + 0, bf1 + 7, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[1], bf1[6], bf1 + 1, bf1 + 6, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[2], bf1[5], bf1 + 2, bf1 + 5, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[3], bf1[4], bf1 + 3, bf1 + 4, clamp_lo, clamp_hi);

  temp1 = half_btf_sse4_1(cospim32, &bf1[10], cospi32, &bf1[13], rounding, bit);
  bf1[13] =
      half_btf_sse4_1(cospi32, &bf1[10], cospi32, &bf1[13], rounding, bit);
  bf1[10] = temp1;
  temp2 = half_btf_sse4_1(cospim32, &bf1[11], cospi32, &bf1[12], rounding, bit);
  bf1[12] =
      half_btf_sse4_1(cospi32, &bf1[11], cospi32, &bf1[12], rounding, bit);
  bf1[11] = temp2;

  addsub_sse4_1(bf1[16], bf1[23], bf1 + 16, bf1 + 23, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[17], bf1[22], bf1 + 17, bf1 + 22, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[18], bf1[21], bf1 + 18, bf1 + 21, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[19], bf1[20], bf1 + 19, bf1 + 20, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[31], bf1[24], bf1 + 31, bf1 + 24, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[30], bf1[25], bf1 + 30, bf1 + 25, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[29], bf1[26], bf1 + 29, bf1 + 26, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[28], bf1[27], bf1 + 28, bf1 + 27, clamp_lo, clamp_hi);
}